

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# srv_state.hxx
# Opt level: O0

ptr<buffer> __thiscall nuraft::srv_state::serialize_v1p(srv_state *this,size_t version)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr<buffer> *in_RSI;
  buffer_serializer *in_RDI;
  ptr<buffer> pVar1;
  buffer_serializer bs;
  ptr<buffer> *buf;
  size_t in_stack_000000e8;
  buffer_serializer *this_00;
  undefined4 in_stack_ffffffffffffffb8;
  int32_t in_stack_ffffffffffffffbc;
  uint8_t val;
  buffer_serializer *in_stack_ffffffffffffffc0;
  
  this_00 = in_RDI;
  nuraft::buffer::alloc(in_stack_000000e8);
  buffer_serializer::buffer_serializer(this_00,in_RSI,(endianness)((ulong)in_RDI >> 0x20));
  buffer_serializer::put_u8
            (in_stack_ffffffffffffffc0,(uint8_t)((uint)in_stack_ffffffffffffffbc >> 0x18));
  std::__atomic_base::operator_cast_to_unsigned_long((__atomic_base<unsigned_long> *)in_RSI);
  buffer_serializer::put_u64
            (in_stack_ffffffffffffffc0,CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
            );
  std::__atomic_base::operator_cast_to_int((__atomic_base<int> *)in_RSI);
  buffer_serializer::put_i32(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  val = (uint8_t)((uint)in_stack_ffffffffffffffbc >> 0x18);
  std::atomic::operator_cast_to_bool((atomic<bool> *)in_RSI);
  buffer_serializer::put_u8(in_stack_ffffffffffffffc0,val);
  pVar1.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar1.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (ptr<buffer>)pVar1.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<buffer> serialize_v1p(size_t version) const {
        //   << Format >>
        // version          1 byte
        // term             8 bytes
        // voted_for        4 bytes
        // election timer   1 byte
        ptr<buffer> buf = buffer::alloc( sizeof(uint8_t) +
                                         sizeof(uint64_t) +
                                         sizeof(int32_t) +
                                         sizeof(uint8_t) );
        buffer_serializer bs(buf);
        bs.put_u8(version);
        bs.put_u64(term_);
        bs.put_i32(voted_for_);
        bs.put_u8( election_timer_allowed_ ? 1 : 0 );
        return buf;
    }